

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::DataTypeApplyOp(ImGuiDataType data_type,int op,void *output,void *arg1,void *arg2)

{
  char cVar1;
  uchar uVar2;
  short sVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  longlong lVar7;
  unsigned_long_long uVar8;
  void *arg2_local;
  void *arg1_local;
  void *output_local;
  int op_local;
  ImGuiDataType data_type_local;
  
  if (op != 0x2b && op != 0x2d) {
    __assert_fail("op == \'+\' || op == \'-\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x794,
                  "void ImGui::DataTypeApplyOp(ImGuiDataType, int, void *, const void *, const void *)"
                 );
  }
  switch(data_type) {
  case 0:
    if (op == 0x2b) {
      cVar1 = ImAddClampOverflow<signed_char>(*arg1,*arg2,-0x80,'\x7f');
      *(char *)output = cVar1;
    }
    if (op == 0x2d) {
      cVar1 = ImSubClampOverflow<signed_char>(*arg1,*arg2,-0x80,'\x7f');
      *(char *)output = cVar1;
    }
    break;
  case 1:
    if (op == 0x2b) {
      uVar2 = ImAddClampOverflow<unsigned_char>(*arg1,*arg2,'\0',0xff);
      *(uchar *)output = uVar2;
    }
    if (op == 0x2d) {
      uVar2 = ImSubClampOverflow<unsigned_char>(*arg1,*arg2,'\0',0xff);
      *(uchar *)output = uVar2;
    }
    break;
  case 2:
    if (op == 0x2b) {
      sVar3 = ImAddClampOverflow<short>(*arg1,*arg2,-0x8000,0x7fff);
      *(short *)output = sVar3;
    }
    if (op == 0x2d) {
      sVar3 = ImSubClampOverflow<short>(*arg1,*arg2,-0x8000,0x7fff);
      *(short *)output = sVar3;
    }
    break;
  case 3:
    if (op == 0x2b) {
      uVar4 = ImAddClampOverflow<unsigned_short>(*arg1,*arg2,0,0xffff);
      *(unsigned_short *)output = uVar4;
    }
    if (op == 0x2d) {
      uVar4 = ImSubClampOverflow<unsigned_short>(*arg1,*arg2,0,0xffff);
      *(unsigned_short *)output = uVar4;
    }
    break;
  case 4:
    if (op == 0x2b) {
      iVar5 = ImAddClampOverflow<int>(*arg1,*arg2,-0x80000000,0x7fffffff);
      *(int *)output = iVar5;
    }
    if (op == 0x2d) {
      iVar5 = ImSubClampOverflow<int>(*arg1,*arg2,-0x80000000,0x7fffffff);
      *(int *)output = iVar5;
    }
    break;
  case 5:
    if (op == 0x2b) {
      uVar6 = ImAddClampOverflow<unsigned_int>(*arg1,*arg2,0,0xffffffff);
      *(uint *)output = uVar6;
    }
    if (op == 0x2d) {
      uVar6 = ImSubClampOverflow<unsigned_int>(*arg1,*arg2,0,0xffffffff);
      *(uint *)output = uVar6;
    }
    break;
  case 6:
    if (op == 0x2b) {
      lVar7 = ImAddClampOverflow<long_long>(*arg1,*arg2,-0x8000000000000000,0x7fffffffffffffff);
      *(longlong *)output = lVar7;
    }
    if (op == 0x2d) {
      lVar7 = ImSubClampOverflow<long_long>(*arg1,*arg2,-0x8000000000000000,0x7fffffffffffffff);
      *(longlong *)output = lVar7;
    }
    break;
  case 7:
    if (op == 0x2b) {
      uVar8 = ImAddClampOverflow<unsigned_long_long>(*arg1,*arg2,0,0xffffffffffffffff);
      *(unsigned_long_long *)output = uVar8;
    }
    if (op == 0x2d) {
      uVar8 = ImSubClampOverflow<unsigned_long_long>(*arg1,*arg2,0,0xffffffffffffffff);
      *(unsigned_long_long *)output = uVar8;
    }
    break;
  case 8:
    if (op == 0x2b) {
      *(float *)output = *arg1 + *arg2;
    }
    if (op == 0x2d) {
      *(float *)output = *arg1 - *arg2;
    }
    break;
  case 9:
    if (op == 0x2b) {
      *(double *)output = *arg1 + *arg2;
    }
    if (op == 0x2d) {
      *(double *)output = *arg1 - *arg2;
    }
    break;
  case 10:
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x7c1,
                  "void ImGui::DataTypeApplyOp(ImGuiDataType, int, void *, const void *, const void *)"
                 );
  }
  return;
}

Assistant:

void ImGui::DataTypeApplyOp(ImGuiDataType data_type, int op, void* output, const void* arg1, const void* arg2)
{
    IM_ASSERT(op == '+' || op == '-');
    switch (data_type)
    {
        case ImGuiDataType_S8:
            if (op == '+') { *(ImS8*)output  = ImAddClampOverflow(*(const ImS8*)arg1,  *(const ImS8*)arg2,  IM_S8_MIN,  IM_S8_MAX); }
            if (op == '-') { *(ImS8*)output  = ImSubClampOverflow(*(const ImS8*)arg1,  *(const ImS8*)arg2,  IM_S8_MIN,  IM_S8_MAX); }
            return;
        case ImGuiDataType_U8:
            if (op == '+') { *(ImU8*)output  = ImAddClampOverflow(*(const ImU8*)arg1,  *(const ImU8*)arg2,  IM_U8_MIN,  IM_U8_MAX); }
            if (op == '-') { *(ImU8*)output  = ImSubClampOverflow(*(const ImU8*)arg1,  *(const ImU8*)arg2,  IM_U8_MIN,  IM_U8_MAX); }
            return;
        case ImGuiDataType_S16:
            if (op == '+') { *(ImS16*)output = ImAddClampOverflow(*(const ImS16*)arg1, *(const ImS16*)arg2, IM_S16_MIN, IM_S16_MAX); }
            if (op == '-') { *(ImS16*)output = ImSubClampOverflow(*(const ImS16*)arg1, *(const ImS16*)arg2, IM_S16_MIN, IM_S16_MAX); }
            return;
        case ImGuiDataType_U16:
            if (op == '+') { *(ImU16*)output = ImAddClampOverflow(*(const ImU16*)arg1, *(const ImU16*)arg2, IM_U16_MIN, IM_U16_MAX); }
            if (op == '-') { *(ImU16*)output = ImSubClampOverflow(*(const ImU16*)arg1, *(const ImU16*)arg2, IM_U16_MIN, IM_U16_MAX); }
            return;
        case ImGuiDataType_S32:
            if (op == '+') { *(ImS32*)output = ImAddClampOverflow(*(const ImS32*)arg1, *(const ImS32*)arg2, IM_S32_MIN, IM_S32_MAX); }
            if (op == '-') { *(ImS32*)output = ImSubClampOverflow(*(const ImS32*)arg1, *(const ImS32*)arg2, IM_S32_MIN, IM_S32_MAX); }
            return;
        case ImGuiDataType_U32:
            if (op == '+') { *(ImU32*)output = ImAddClampOverflow(*(const ImU32*)arg1, *(const ImU32*)arg2, IM_U32_MIN, IM_U32_MAX); }
            if (op == '-') { *(ImU32*)output = ImSubClampOverflow(*(const ImU32*)arg1, *(const ImU32*)arg2, IM_U32_MIN, IM_U32_MAX); }
            return;
        case ImGuiDataType_S64:
            if (op == '+') { *(ImS64*)output = ImAddClampOverflow(*(const ImS64*)arg1, *(const ImS64*)arg2, IM_S64_MIN, IM_S64_MAX); }
            if (op == '-') { *(ImS64*)output = ImSubClampOverflow(*(const ImS64*)arg1, *(const ImS64*)arg2, IM_S64_MIN, IM_S64_MAX); }
            return;
        case ImGuiDataType_U64:
            if (op == '+') { *(ImU64*)output = ImAddClampOverflow(*(const ImU64*)arg1, *(const ImU64*)arg2, IM_U64_MIN, IM_U64_MAX); }
            if (op == '-') { *(ImU64*)output = ImSubClampOverflow(*(const ImU64*)arg1, *(const ImU64*)arg2, IM_U64_MIN, IM_U64_MAX); }
            return;
        case ImGuiDataType_Float:
            if (op == '+') { *(float*)output = *(const float*)arg1 + *(const float*)arg2; }
            if (op == '-') { *(float*)output = *(const float*)arg1 - *(const float*)arg2; }
            return;
        case ImGuiDataType_Double:
            if (op == '+') { *(double*)output = *(const double*)arg1 + *(const double*)arg2; }
            if (op == '-') { *(double*)output = *(const double*)arg1 - *(const double*)arg2; }
            return;
        case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
}